

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_factory.cpp
# Opt level: O2

unique_ptr<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_> __thiscall
n_e_s::core::CpuFactory::create_mos6502
          (CpuFactory *this,CpuRegisters *registers,IMmu *mmu,IPpu *ppu)

{
  _Head_base<0UL,_n_e_s::core::Mos6502_*,_false> _Var1;
  __single_object cpu;
  _Head_base<0UL,_n_e_s::core::Mos6502_*,_false> local_50;
  IMmu *local_48;
  CpuRegisters *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_48 = mmu;
  local_40 = registers;
  std::make_unique<n_e_s::core::Mos6502,n_e_s::core::CpuRegisters*const&,n_e_s::core::IMmu*const&>
            ((CpuRegisters **)&local_50,(IMmu **)&local_40);
  local_38._8_8_ = 0;
  local_38._M_unused._M_object = local_50._M_head_impl;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/cpu_factory.cpp:12:26)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/cpu_factory.cpp:12:26)>
             ::_M_manager;
  (*ppu->_vptr_IPpu[5])(ppu);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  _Var1._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (Mos6502 *)0x0;
  *(Mos6502 **)this = _Var1._M_head_impl;
  std::unique_ptr<n_e_s::core::Mos6502,_std::default_delete<n_e_s::core::Mos6502>_>::~unique_ptr
            ((unique_ptr<n_e_s::core::Mos6502,_std::default_delete<n_e_s::core::Mos6502>_> *)
             &local_50);
  return (__uniq_ptr_data<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>,_true,_true>
          )(__uniq_ptr_data<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<IMos6502> CpuFactory::create_mos6502(
        CpuRegisters *const registers,
        IMmu *const mmu,
        IPpu *const ppu) {
    auto cpu = std::make_unique<Mos6502>(registers, mmu);
    ppu->set_nmi_handler([ptr = cpu.get()] { ptr->set_nmi(true); });
    return cpu;
}